

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_multisample_target.c
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ALLEGRO_FONT *pAVar6;
  char cVar7;
  long lVar8;
  undefined8 uVar9;
  long *plVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long lVar13;
  uint uVar14;
  code *pcVar15;
  ulong uVar16;
  char *format;
  bool bVar17;
  bool bVar19;
  int iVar20;
  ulong uVar21;
  float fVar22;
  undefined4 uVar23;
  float fVar24;
  undefined4 uVar25;
  ALLEGRO_EVENT event;
  int local_78 [8];
  int local_58;
  bool bVar18;
  
  pcVar15 = atexit;
  cVar7 = al_install_system(0x85020700,atexit);
  if (cVar7 == '\0') {
    format = "Failed to init Allegro.\n";
  }
  else {
    cVar7 = al_init_image_addon();
    if (cVar7 == '\0') {
      format = "Failed to init IIO addon.\n";
    }
    else {
      al_init_font_addon();
      example.font = (ALLEGRO_FONT *)al_create_builtin_font();
      al_init_primitives_addon();
      pcVar15 = (code *)0x1cc;
      lVar8 = al_create_display(0x294,0x1cc);
      if (lVar8 == 0) {
        format = "Error creating display.\n";
      }
      else {
        cVar7 = al_install_keyboard();
        if (cVar7 != '\0') {
          al_set_new_bitmap_flags(1);
          uVar9 = al_create_bitmap(0x18,0x18);
          uVar21 = 0;
          plVar10 = (long *)al_lock_bitmap(uVar9,0x11,0);
          iVar20 = *(int *)((long)plVar10 + 0xc);
          lVar13 = *plVar10 + 3;
          do {
            uVar16 = 0;
            do {
              *(undefined2 *)(lVar13 + -3 + uVar16 * 4) = 0;
              *(undefined1 *)(lVar13 + -1 + uVar16 * 4) = 0;
              *(byte *)(lVar13 + uVar16 * 4) = -((char)(uVar16 >> 3) + (char)(uVar21 >> 3) & 1U);
              uVar16 = uVar16 + 1;
            } while (uVar16 != 0x18);
            uVar21 = uVar21 + 1;
            lVar13 = lVar13 + iVar20;
          } while (uVar21 != 0x18);
          al_unlock_bitmap(uVar9);
          bVar18 = false;
          bVar17 = false;
          al_set_new_bitmap_flags(0);
          al_set_new_bitmap_samples(0);
          example.targets[0] = (ALLEGRO_BITMAP *)al_create_bitmap(300,200);
          example.targets[1] = (ALLEGRO_BITMAP *)al_create_bitmap(300,200);
          al_set_new_bitmap_samples(4);
          example.targets[2] = (ALLEGRO_BITMAP *)al_create_bitmap(300,200);
          example.targets[3] = (ALLEGRO_BITMAP *)al_create_bitmap(300,200);
          al_set_new_bitmap_samples(0);
          al_set_new_bitmap_flags(0xc0);
          example.bitmap_filter = (ALLEGRO_BITMAP *)al_clone_bitmap(uVar9);
          al_set_new_bitmap_flags(0);
          example.bitmap_normal = (ALLEGRO_BITMAP *)al_clone_bitmap(uVar9);
          example.sub = (ALLEGRO_BITMAP *)al_create_sub_bitmap(uVar9,0,0,0x1e,0x1e);
          example.step[0] = (ALLEGRO_BITMAP *)al_create_bitmap(0x1e,0x1e);
          example.step[1] = (ALLEGRO_BITMAP *)al_create_bitmap(0x1e,0x1e);
          example.step[2] = (ALLEGRO_BITMAP *)al_create_bitmap(0x1e,0x1e);
          example.step[3] = (ALLEGRO_BITMAP *)al_create_bitmap(0x1e,0x1e);
          uVar9 = al_create_timer(0x11111111);
          uVar11 = al_create_event_queue();
          uVar12 = al_get_keyboard_event_source();
          al_register_event_source(uVar11,uVar12);
          uVar12 = al_get_timer_event_source(uVar9);
          al_register_event_source(uVar11,uVar12);
          uVar12 = al_get_display_event_source(lVar8);
          al_register_event_source(uVar11,uVar12);
          al_start_timer(uVar9);
          bVar19 = true;
          do {
            if (bVar19) {
              al_set_target_bitmap(example.targets[1]);
              draw("filtered",example.bitmap_filter);
              al_set_target_bitmap(example.targets[0]);
              draw("no filter",example.bitmap_normal);
              al_set_target_bitmap(example.targets[3]);
              draw("filtered, multi-sample x4",example.bitmap_filter);
              al_set_target_bitmap(example.targets[2]);
              draw("no filter, multi-sample x4",example.bitmap_normal);
              if (example.update_step == true) {
                fVar22 = (float)example.step_y;
                fVar24 = (float)example.step_x;
                lVar8 = 0;
                do {
                  al_set_target_bitmap(example.step[lVar8]);
                  al_reparent_bitmap(example.sub,example.targets[lVar8],(int)fVar24,(int)fVar22,0x1e
                                     ,0x1e);
                  __cxa_atexit(0,0,example.sub,0);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 4);
                example.update_step = false;
              }
              uVar9 = al_get_current_display();
              al_set_target_backbuffer(uVar9);
              al_map_rgb_f(0x3f000000,0,0);
              al_clear_to_color();
              bVar19 = false;
              __cxa_atexit(0x41a00000,0x41a00000,example.targets[0],0);
              __cxa_atexit(0x41a00000,0x43700000,example.targets[1],0);
              __cxa_atexit(0x43aa0000,0x41a00000,example.targets[2],0);
              __cxa_atexit(0x43aa0000,0x43700000,example.targets[3],0);
              al_draw_scaled_rotated_bitmap
                        (0x41700000,0x41700000,0x43870000,0x432a0000,0x40800000,0x40800000,0,
                         example.step[0],0);
              al_draw_scaled_rotated_bitmap
                        (0x41700000,0x41700000,0x43870000,0x43c30000,0x40800000,0x40800000,
                         example.step[1],0);
              al_draw_scaled_rotated_bitmap
                        (0x41700000,0x41700000,0x44138000,0x432a0000,0x40800000,0x40800000,
                         example.step[2],0);
              al_draw_scaled_rotated_bitmap(example.step[3],0);
              al_flip_display();
            }
            do {
              al_wait_for_event(uVar11,local_78);
              if (local_78[0] == 0x2a) {
                bVar17 = true;
                bVar18 = true;
              }
              else if (local_78[0] == 0x1e) {
                example.bitmap_t = example.bitmap_t + 1.0;
                iVar20 = 0;
                lVar8 = 0;
                do {
                  dVar1 = sin((double)(((float)iVar20 + example.bitmap_t) / 180.0) *
                              3.141592653589793);
                  dVar2 = (double)((float)(int)lVar8 * 6.2831855 * 0.0625);
                  dVar3 = cos(dVar2);
                  example.bitmap_x[lVar8] = (float)(dVar3 * (double)((float)dVar1 * 90.0) + 100.0);
                  dVar2 = sin(dVar2);
                  example.bitmap_y[lVar8] = (float)(dVar2 * (double)((float)dVar1 * 90.0) + 100.0);
                  lVar8 = lVar8 + 1;
                  iVar20 = iVar20 + 0x28;
                } while (lVar8 != 8);
                if (example.step_t == 0) {
                  example.step_y = (int)(example.bitmap_y[1] + -15.0);
                  example.step_x = (int)(example.bitmap_x[1] + -15.0);
                  example.step_t = 0x3c;
                  example.update_step = true;
                }
                example.step_t = example.step_t + -1;
                bVar19 = true;
              }
              else if ((local_78[0] == 0xb) && (bVar17 = bVar18, local_58 == 0x3b)) {
                bVar17 = true;
                bVar18 = bVar17;
              }
              cVar7 = al_is_event_queue_empty(uVar11);
            } while (cVar7 == '\0');
          } while (!bVar17);
          return 0;
        }
        format = "Error installing keyboard.\n";
      }
    }
  }
  abort_example(format);
  al_color_name("white");
  al_clear_to_color();
  pAVar6 = example.font;
  uVar14 = 0;
  al_map_rgb(0,0,0);
  al_draw_text(pAVar6,0,format);
  dVar1 = 0.0;
  do {
    uVar25 = 0x3f800000;
    uVar23 = al_color_hsv((float)(uVar14 >> 4),0x3f800000,0x3f800000);
    dVar2 = (double)(float)(dVar1 * 6.283185307179586 * 0.0625);
    dVar3 = cos(dVar2);
    dVar4 = sin(dVar2);
    dVar5 = cos(dVar2);
    dVar2 = sin(dVar2);
    al_draw_line((float)(dVar3 * 10.0 + 100.0),(float)(dVar4 * 10.0 + 100.0),
                 (float)(dVar5 * 90.0 + 100.0),(float)(dVar2 * 90.0 + 100.0),uVar23,uVar25,
                 0x40400000);
    dVar1 = dVar1 + 1.0;
    uVar14 = uVar14 + 0x168;
  } while (uVar14 != 0x1680);
  lVar8 = 0;
  do {
    iVar20 = al_get_bitmap_width(pcVar15);
    iVar20 = al_draw_rotated_bitmap
                       ((float)(iVar20 / 2),(float)(iVar20 / 2),example.bitmap_x[lVar8],
                        example.bitmap_y[lVar8],(float)(int)lVar8 * 6.2831855 * 0.0625,pcVar15,0);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  return iVar20;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_DISPLAY *display;
   int w = 20 + 300 + 20 + 300 + 20, h = 20 + 200 + 20 + 200 + 20;
   bool done = false;
   bool need_redraw = true;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Failed to init Allegro.\n");
   }

   if (!al_init_image_addon()) {
      abort_example("Failed to init IIO addon.\n");
   }

   al_init_font_addon();
   example.font = al_create_builtin_font();

   al_init_primitives_addon();

   init_platform_specific();

   display = al_create_display(w, h);
   if (!display) {
      abort_example("Error creating display.\n");
   }

   if (!al_install_keyboard()) {
      abort_example("Error installing keyboard.\n");
   }

   init();

   timer = al_create_timer(1.0 / FPS);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());

   al_register_event_source(queue, al_get_timer_event_source(timer));
   
   al_register_event_source(queue, al_get_display_event_source(display));

   al_start_timer(timer);

   while (!done) {
      ALLEGRO_EVENT event;

      if (need_redraw) {
         redraw();
         al_flip_display();
         need_redraw = false;
      }

      while (true) {
         al_wait_for_event(queue, &event);
         switch (event.type) {
            case ALLEGRO_EVENT_KEY_CHAR:
               if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
                  done = true;
               break;

            case ALLEGRO_EVENT_DISPLAY_CLOSE:
               done = true;
               break;

            case ALLEGRO_EVENT_TIMER:
               update();
               need_redraw = true;
               break;
         }
         if (al_is_event_queue_empty(queue))
            break;
      }
   }

   return 0;
}